

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

word Dau_Dsd6TruthCompose_rec(word Func,word *pFanins,int nVars)

{
  int nVars_00;
  int iVar1;
  ulong uVar2;
  word wVar3;
  word wVar4;
  byte bVar5;
  ulong uVar6;
  
  if (1 < Func + 1) {
    uVar2 = (ulong)(uint)nVars + 1;
    iVar1 = nVars + -1;
    do {
      nVars_00 = iVar1;
      if (nVars_00 + 1 < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x155,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
      }
      if (nVars_00 == 0) {
        if (Func == 0x5555555555555555 || s_Truths6[0] == Func) {
          return -(ulong)(s_Truths6[0] != Func) ^ *pFanins;
        }
        __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x158,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
      }
      bVar5 = (byte)(1 << ((byte)nVars_00 & 0x1f));
      uVar6 = uVar2 - 2 & 0xffffffff;
      uVar2 = uVar2 - 1;
      iVar1 = nVars_00 + -1;
    } while ((s_Truths6Neg[uVar6] & (Func >> (bVar5 & 0x3f) ^ Func)) == 0);
    if (6 < uVar2) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                    ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
    }
    uVar2 = s_Truths6Neg[uVar6] & Func;
    wVar3 = Dau_Dsd6TruthCompose_rec(uVar2 << (bVar5 & 0x3f) | uVar2,pFanins,nVars_00);
    wVar4 = Dau_Dsd6TruthCompose_rec
                      ((Func & s_Truths6[uVar6]) >> (bVar5 & 0x3f) | Func & s_Truths6[uVar6],pFanins
                       ,nVars_00);
    Func = (wVar4 ^ wVar3) & pFanins[uVar6] ^ wVar3;
  }
  return Func;
}

Assistant:

word Dau_Dsd6TruthCompose_rec( word Func, word * pFanins, int nVars )
{
    word t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return ~(word)0;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return (Func == s_Truths6[0]) ? pFanins[0] : ~pFanins[0];
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_Dsd6TruthCompose_rec( Func, pFanins, nVars );
    t0 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    return (~pFanins[nVars] & t0) | (pFanins[nVars] & t1);
}